

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSort.c
# Opt level: O3

void sort_rec(int *array,int size,_func_int_void_ptr_void_ptr *comp)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  int *piVar8;
  int *piVar9;
  long lVar10;
  int pivot;
  ulong local_50;
  int local_34;
  
  local_50 = (ulong)(uint)size;
  if (size < 0x10) {
    if (1 < size) {
      piVar8 = array + 1;
      uVar4 = 1;
      uVar2 = 0;
      do {
        uVar3 = uVar2 & 0xffffffff;
        uVar5 = uVar4;
        piVar9 = piVar8;
        do {
          iVar1 = (*comp)(piVar9,array + (int)uVar3);
          if (iVar1 != 0) {
            uVar3 = uVar5 & 0xffffffff;
          }
          uVar5 = uVar5 + 1;
          piVar9 = piVar9 + 1;
        } while ((uint)size != uVar5);
        iVar1 = array[uVar2];
        array[uVar2] = array[(int)uVar3];
        uVar2 = uVar2 + 1;
        array[(int)uVar3] = iVar1;
        uVar4 = uVar4 + 1;
        piVar8 = piVar8 + 1;
      } while (uVar2 != size - 1);
    }
  }
  else {
    local_34 = array[(uint)size >> 1];
    lVar6 = -1;
    while( true ) {
      lVar6 = (long)(int)lVar6;
      lVar10 = lVar6 * -4;
      lVar7 = lVar6 * 4;
      do {
        lVar7 = lVar7 + 4;
        lVar6 = lVar6 + 1;
        iVar1 = (*comp)((void *)((long)array + lVar7),&local_34);
        lVar10 = lVar10 + -4;
      } while (iVar1 != 0);
      local_50 = (ulong)(int)local_50;
      lVar7 = local_50 * 4;
      do {
        lVar7 = lVar7 + -4;
        local_50 = local_50 - 1;
        iVar1 = (*comp)(&local_34,(void *)((long)array + lVar7));
      } while (iVar1 != 0);
      if ((long)local_50 <= lVar6) break;
      iVar1 = array[lVar6];
      array[lVar6] = array[local_50];
      array[local_50] = iVar1;
    }
    sort_rec(array,(int)lVar6,comp);
    sort_rec((int *)((long)array - lVar10),size - (int)lVar6,comp);
  }
  return;
}

Assistant:

static void sort_rec(int* array, int size, int(*comp)(const void *, const void *))
{
    if (size <= 15)
        selectionsort(array, size, comp);
    else{
        int    pivot = array[size/2];
        int    tmp;
        int    i = -1;
        int    j = size;
        for(;;){
            do i++; while(comp(array + i, &pivot));
            do j--; while(comp(&pivot, array + j));
            if (i >= j) break;
            tmp = array[i]; array[i] = array[j]; array[j] = tmp;
        }
        sort_rec(array    , i     , comp);
        sort_rec(&array[i], size-i, comp);
    }
}